

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O0

void __thiscall DyndepParserTestVersion1::Run(DyndepParserTestVersion1 *this)

{
  int iVar1;
  int iVar2;
  int fail_count;
  DyndepParserTestVersion1 *this_local;
  
  iVar1 = testing::Test::AssertionFailures(g_current_test);
  DyndepParserTest::AssertParse(&this->super_DyndepParserTest,"ninja_dyndep_version = 1\n");
  iVar2 = testing::Test::AssertionFailures(g_current_test);
  if (iVar1 != iVar2) {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(DyndepParserTest, Version1) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"ninja_dyndep_version = 1\n"));
}